

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O0

void __thiscall
booster::callback<void_()>::callback<chat::binder>(callback<void_()> *this,binder *func)

{
  callable_impl<void,_chat::binder> *this_00;
  binder *in_RSI;
  binder *in_RDI;
  binder *in_stack_ffffffffffffff98;
  undefined1 add_ref;
  
  this_00 = (callable_impl<void,_chat::binder> *)operator_new(0x28);
  chat::binder::binder(in_RDI,in_stack_ffffffffffffff98);
  add_ref = (undefined1)((ulong)in_RDI >> 0x38);
  callable_impl<void,_chat::binder>::callable_impl(this_00,in_RSI);
  intrusive_ptr<booster::callable<void_()>_>::intrusive_ptr
            ((intrusive_ptr<booster::callable<void_()>_> *)this_00,(callable<void_()> *)in_RSI,
             (bool)add_ref);
  chat::binder::~binder((binder *)0x131330);
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}